

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<QCss::StyleSheet>::growAppend
          (QCommonArrayOps<QCss::StyleSheet> *this,StyleSheet *b,StyleSheet *e)

{
  long n;
  StyleSheet *pSVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::StyleSheet> local_48;
  StyleSheet *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = ((long)e - (long)b >> 5) * -0x3333333333333333;
    local_48.d = (Data *)0x0;
    local_48.ptr = (StyleSheet *)0x0;
    local_48.size = 0;
    pSVar1 = (this->super_Type).super_QGenericArrayOps<QCss::StyleSheet>.
             super_QArrayDataPointer<QCss::StyleSheet>.ptr;
    if ((b < pSVar1) ||
       (pSVar1 + (this->super_Type).super_QGenericArrayOps<QCss::StyleSheet>.
                 super_QArrayDataPointer<QCss::StyleSheet>.size <= b)) {
      QArrayDataPointer<QCss::StyleSheet>::detachAndGrow
                ((QArrayDataPointer<QCss::StyleSheet> *)this,GrowsAtEnd,n,(StyleSheet **)0x0,
                 (QArrayDataPointer<QCss::StyleSheet> *)0x0);
      pSVar1 = b;
    }
    else {
      QArrayDataPointer<QCss::StyleSheet>::detachAndGrow
                ((QArrayDataPointer<QCss::StyleSheet> *)this,GrowsAtEnd,n,&local_28,&local_48);
      pSVar1 = local_28;
    }
    QGenericArrayOps<QCss::StyleSheet>::copyAppend
              ((QGenericArrayOps<QCss::StyleSheet> *)this,pSVar1,
               (StyleSheet *)(((long)e - (long)b) + (long)pSVar1));
    QArrayDataPointer<QCss::StyleSheet>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }